

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O3

void * nghttp2_map_find(nghttp2_map *map,nghttp2_map_key_type key)

{
  nghttp2_map_bucket *pnVar1;
  char cVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  cVar2 = (char)map->tablelenbits;
  uVar5 = (ulong)((uint)(key * -0x61c88647) >> (-cVar2 & 0x1fU));
  pnVar1 = map->table;
  pvVar3 = pnVar1[uVar5].data;
  if (pvVar3 != (void *)0x0) {
    uVar6 = map->tablelen - 1;
    uVar7 = 0xffffffffffffffff;
    do {
      if (pnVar1[uVar5].key == key) {
        return pvVar3;
      }
      uVar4 = uVar6 & (int)uVar5 + 1U;
      uVar5 = (ulong)uVar4;
      pvVar3 = pnVar1[uVar5].data;
    } while ((pvVar3 != (void *)0x0) &&
            (uVar7 = uVar7 + 1,
            uVar7 < (uVar6 & uVar4 - (pnVar1[uVar5].hash >> (0x20U - cVar2 & 0x1f)))));
  }
  return (void *)0x0;
}

Assistant:

void *nghttp2_map_find(nghttp2_map *map, nghttp2_map_key_type key) {
  uint32_t h = hash(key);
  size_t idx = h2idx(h, map->tablelenbits);
  nghttp2_map_bucket *bkt;
  size_t d = 0;

  for (;;) {
    bkt = &map->table[idx];

    if (bkt->data == NULL ||
        d > distance(map->tablelen, map->tablelenbits, bkt, idx)) {
      return NULL;
    }

    if (bkt->key == key) {
      return bkt->data;
    }

    ++d;
    idx = (idx + 1) & (map->tablelen - 1);
  }
}